

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx512.cpp
# Opt level: O0

int __thiscall ncnn::LSTM_x86_avx512::create_pipeline_int8(LSTM_x86_avx512 *this,Option *opt)

{
  int *piVar1;
  ulong uVar2;
  int iVar3;
  undefined8 *puVar4;
  byte *in_RSI;
  long in_RDI;
  int size;
  int num_directions;
  Mat *in_stack_00000f98;
  Mat *in_stack_00000fa0;
  Mat *in_stack_00000fa8;
  Mat *in_stack_00000fb0;
  Mat *in_stack_00000fb8;
  Mat *in_stack_00000fc0;
  undefined4 in_stack_fffffffffffffefc;
  Option *in_stack_ffffffffffffff20;
  
  iVar3 = 1;
  if (*(int *)(in_RDI + 0xd8) == 2) {
    iVar3 = 2;
  }
  uVar2 = (long)*(int *)(in_RDI + 0xd4) / (long)iVar3;
  uVar2 = (long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
          (long)*(int *)(in_RDI + 0xdc);
  lstm_transform_weight_int8
            (in_stack_00000fc0,in_stack_00000fb8,in_stack_00000fb0,in_stack_00000fa8,
             in_stack_00000fa0,in_stack_00000f98,(Mat *)(in_RDI + 0x2e0),
             (Mat *)CONCAT44(in_stack_fffffffffffffefc,
                             (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 |
                                         uVar2 & 0xffffffff) / 4)),*(int *)(in_RDI + 0xd0),iVar3,
             *(int *)(in_RDI + 0xdc),(int)in_RSI,in_stack_ffffffffffffff20);
  if ((*in_RSI & 1) != 0) {
    puVar4 = (undefined8 *)(in_RDI + 0x130);
    if (*(long *)(in_RDI + 0x138) != 0) {
      piVar1 = *(int **)(in_RDI + 0x138);
      LOCK();
      iVar3 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (iVar3 == 1) {
        if (*(long *)(in_RDI + 0x150) == 0) {
          if ((void *)*puVar4 != (void *)0x0) {
            free((void *)*puVar4);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x150) + 0x18))(*(long **)(in_RDI + 0x150),*puVar4);
        }
      }
    }
    *puVar4 = 0;
    *(undefined8 *)(in_RDI + 0x140) = 0;
    *(undefined4 *)(in_RDI + 0x148) = 0;
    *(undefined4 *)(in_RDI + 0x158) = 0;
    *(undefined4 *)(in_RDI + 0x15c) = 0;
    *(undefined4 *)(in_RDI + 0x160) = 0;
    *(undefined4 *)(in_RDI + 0x164) = 0;
    *(undefined4 *)(in_RDI + 0x168) = 0;
    *(undefined8 *)(in_RDI + 0x170) = 0;
    *(undefined8 *)(in_RDI + 0x138) = 0;
    puVar4 = (undefined8 *)(in_RDI + 0x178);
    if (*(long *)(in_RDI + 0x180) != 0) {
      piVar1 = *(int **)(in_RDI + 0x180);
      LOCK();
      iVar3 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (iVar3 == 1) {
        if (*(long *)(in_RDI + 0x198) == 0) {
          if ((void *)*puVar4 != (void *)0x0) {
            free((void *)*puVar4);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x198) + 0x18))(*(long **)(in_RDI + 0x198),*puVar4);
        }
      }
    }
    *puVar4 = 0;
    *(undefined8 *)(in_RDI + 0x188) = 0;
    *(undefined4 *)(in_RDI + 400) = 0;
    *(undefined4 *)(in_RDI + 0x1a0) = 0;
    *(undefined4 *)(in_RDI + 0x1a4) = 0;
    *(undefined4 *)(in_RDI + 0x1a8) = 0;
    *(undefined4 *)(in_RDI + 0x1ac) = 0;
    *(undefined4 *)(in_RDI + 0x1b0) = 0;
    *(undefined8 *)(in_RDI + 0x1b8) = 0;
    *(undefined8 *)(in_RDI + 0x180) = 0;
    puVar4 = (undefined8 *)(in_RDI + 0xe8);
    if (*(long *)(in_RDI + 0xf0) != 0) {
      piVar1 = *(int **)(in_RDI + 0xf0);
      LOCK();
      iVar3 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (iVar3 == 1) {
        if (*(long *)(in_RDI + 0x108) == 0) {
          if ((void *)*puVar4 != (void *)0x0) {
            free((void *)*puVar4);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x108) + 0x18))(*(long **)(in_RDI + 0x108),*puVar4);
        }
      }
    }
    *puVar4 = 0;
    *(undefined8 *)(in_RDI + 0xf8) = 0;
    *(undefined4 *)(in_RDI + 0x100) = 0;
    *(undefined4 *)(in_RDI + 0x110) = 0;
    *(undefined4 *)(in_RDI + 0x114) = 0;
    *(undefined4 *)(in_RDI + 0x118) = 0;
    *(undefined4 *)(in_RDI + 0x11c) = 0;
    *(undefined4 *)(in_RDI + 0x120) = 0;
    *(undefined8 *)(in_RDI + 0x128) = 0;
    *(undefined8 *)(in_RDI + 0xf0) = 0;
    puVar4 = (undefined8 *)(in_RDI + 0x250);
    if (*(long *)(in_RDI + 600) != 0) {
      piVar1 = *(int **)(in_RDI + 600);
      LOCK();
      iVar3 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (iVar3 == 1) {
        if (*(long *)(in_RDI + 0x270) == 0) {
          if ((void *)*puVar4 != (void *)0x0) {
            free((void *)*puVar4);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x270) + 0x18))(*(long **)(in_RDI + 0x270),*puVar4);
        }
      }
    }
    *puVar4 = 0;
    *(undefined8 *)(in_RDI + 0x260) = 0;
    *(undefined4 *)(in_RDI + 0x268) = 0;
    *(undefined4 *)(in_RDI + 0x278) = 0;
    *(undefined4 *)(in_RDI + 0x27c) = 0;
    *(undefined4 *)(in_RDI + 0x280) = 0;
    *(undefined4 *)(in_RDI + 0x284) = 0;
    *(undefined4 *)(in_RDI + 0x288) = 0;
    *(undefined8 *)(in_RDI + 0x290) = 0;
    *(undefined8 *)(in_RDI + 600) = 0;
    puVar4 = (undefined8 *)(in_RDI + 0x208);
    if (*(long *)(in_RDI + 0x210) != 0) {
      piVar1 = *(int **)(in_RDI + 0x210);
      LOCK();
      iVar3 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (iVar3 == 1) {
        if (*(long *)(in_RDI + 0x228) == 0) {
          if ((void *)*puVar4 != (void *)0x0) {
            free((void *)*puVar4);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x228) + 0x18))(*(long **)(in_RDI + 0x228),*puVar4);
        }
      }
    }
    *puVar4 = 0;
    puVar4[2] = 0;
    *(undefined4 *)(puVar4 + 3) = 0;
    *(undefined4 *)(puVar4 + 5) = 0;
    *(undefined4 *)((long)puVar4 + 0x2c) = 0;
    *(undefined4 *)(puVar4 + 6) = 0;
    *(undefined4 *)((long)puVar4 + 0x34) = 0;
    *(undefined4 *)(puVar4 + 7) = 0;
    puVar4[8] = 0;
    puVar4[1] = 0;
  }
  return 0;
}

Assistant:

int LSTM_x86_avx512::create_pipeline_int8(const Option& opt)
{
    // pack IFOG
    const int num_directions = direction == 2 ? 2 : 1;
    const int size = weight_data_size / num_directions / hidden_size / 4;

    lstm_transform_weight_int8(weight_xc_data, weight_xc_data_int8_scales, weight_hc_data, weight_hc_data_int8_scales, bias_c_data, weight_data_tm, weight_data_tm_int8_descales, bias_c_data_packed, size, num_output, num_directions, hidden_size, opt);

    if (opt.lightmode)
    {
        weight_xc_data.release();
        bias_c_data.release();
        weight_hc_data.release();
        weight_xc_data_int8_scales.release();
        weight_hc_data_int8_scales.release();
    }

    return 0;
}